

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponsePoller.cpp
# Opt level: O0

int __thiscall
aeron::archive::ControlResponsePoller::poll
          (ControlResponsePoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  element_type *this_00;
  controlled_poll_fragment_handler_t local_30;
  ControlResponsePoller *local_10;
  ControlResponsePoller *this_local;
  
  this->controlSessionId_ = -1;
  this->correlationId_ = -1;
  this->relevantId_ = -1;
  this->templateId_ = -1;
  this->isPollComplete_ = false;
  local_10 = this;
  this_00 = std::__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  ControlledFragmentAssembler::handler(&local_30,&this->fragmentAssembler_);
  iVar1 = Subscription::
          controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>>
                    (this_00,&local_30,this->fragmentLimit_);
  std::
  function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
  ::~function(&local_30);
  return iVar1;
}

Assistant:

std::int32_t ControlResponsePoller::poll() {
    controlSessionId_ = -1;
    correlationId_ = -1;
    relevantId_ = -1;
    templateId_ = -1;
    isPollComplete_ = false;

    return subscription_->controlledPoll(fragmentAssembler_.handler(), fragmentLimit_);
}